

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

bool StringFormatter<std::__cxx11::string>::output_hex_data<std::__cxx11::string>
               (ostream *os,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
               )

{
  ostream *poVar1;
  pointer pcVar2;
  size_type sVar3;
  ostream oVar4;
  Hexdumper<char> local_28;
  
  poVar1 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  if (poVar1[0xe0] == (ostream)0x30) {
    poVar1 = os + *(long *)(*(long *)os + -0x18);
    if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar1);
      poVar1[0xe0] = oVar4;
      poVar1[0xe1] = (ostream)0x1;
    }
    poVar1[0xe0] = (ostream)0x0;
  }
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
  pcVar2 = (value->_M_dataplus)._M_p;
  sVar3 = value->_M_string_length;
  local_28._last = pcVar2 + sVar3;
  if (sVar3 == 0) {
    local_28._last = (pointer)0x0;
  }
  local_28._first = &Hex::dumper<std::__cxx11::string>(std::__cxx11::string_const&)::x;
  if (sVar3 != 0) {
    local_28._first = pcVar2;
  }
  Hex::operator<<(os,&local_28);
  return true;
}

Assistant:

static bool output_hex_data(std::ostream& os, const T& value)
    { 
        if constexpr (is_hexdumper_v<T>) {
            if (os.fill()=='0')
                os.fill(0); // 0 -> no spaces
            os << std::hex << value;
            return true;
        }
        else if constexpr (is_container_v<T>) {
            if constexpr (std::is_integral_v<typename T::value_type>) {
                if (os.fill()=='0')
                    os.fill(0);
                os << std::hex << Hex::dumper(value);
                return true;
            }
        }
        return false;
    }